

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void __thiscall cmServer::ProcessRequest(cmServer *this,cmConnection *connection,string *input)

{
  _Alloc_hider __p;
  bool bVar1;
  Value *pVVar2;
  cmake *this_00;
  unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> debug;
  allocator<char> local_349;
  Value value;
  Value debugValue;
  cmServerResponse response;
  string local_268;
  string local_248;
  string local_228;
  Value local_208;
  _Any_data local_1e0;
  code *local_1d0;
  code *local_1c8;
  _Any_data local_1c0;
  code *local_1b0;
  code *local_1a8;
  cmServerRequest request;
  Reader reader;
  
  Json::Reader::Reader(&reader);
  Json::Value::Value(&value,nullValue);
  bVar1 = Json::Reader::parse(&reader,input,&value,true);
  if (bVar1) {
    debug._M_t.super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
    ._M_t.super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>.
    super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>,_true,_true>
         )(__uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>)0x0;
    pVVar2 = Json::Value::operator[](&value,"debug");
    Json::Value::Value(&debugValue,pVVar2);
    bVar1 = Json::Value::isNull(&debugValue);
    if (!bVar1) {
      std::make_unique<cmServer::DebugInfo>();
      __p = response.Type._M_dataplus;
      response.Type._M_dataplus._M_p = (pointer)0x0;
      std::__uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::reset
                ((__uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> *)
                 &debug,(pointer)__p._M_p);
      std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::~unique_ptr
                ((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> *)
                 &response);
      pVVar2 = Json::Value::operator[](&debugValue,"dumpToFile");
      Json::Value::asString_abi_cxx11_(&response.Type,pVVar2);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)debug._M_t.
                        super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>
                        .super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl + 8),
                 (string *)&response);
      std::__cxx11::string::~string((string *)&response);
      pVVar2 = Json::Value::operator[](&debugValue,"showStats");
      bVar1 = Json::Value::asBool(pVVar2);
      *(bool *)debug._M_t.
               super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>
               .super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl = bVar1;
    }
    pVVar2 = Json::Value::operator[](&value,&kTYPE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_(&local_228,pVVar2);
    pVVar2 = Json::Value::operator[](&value,&kCOOKIE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_(&local_248,pVVar2);
    Json::Value::Value(&local_208,&value);
    cmServerRequest::cmServerRequest(&request,this,connection,&local_228,&local_248,&local_208);
    Json::Value::~Value(&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    if (request.Type._M_string_length == 0) {
      cmServerResponse::cmServerResponse(&response,&request);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,"No type given in request.",&local_349);
      cmServerResponse::SetError(&response,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      WriteResponse(this,connection,&response,(DebugInfo *)0x0);
    }
    else {
      local_1c0._8_8_ = 0;
      local_1a8 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx:100:5)>
                  ::_M_invoke;
      local_1b0 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx:100:5)>
                  ::_M_manager;
      local_1c0._M_unused._M_object = &request;
      cmSystemTools::SetMessageCallback((MessageCallback *)&local_1c0);
      std::_Function_base::~_Function_base((_Function_base *)&local_1c0);
      if (this->Protocol == (cmServerProtocol *)0x0) {
        SetProtocolVersion(&response,this,&request);
        WriteResponse(this,connection,&response,
                      (DebugInfo *)
                      debug._M_t.
                      super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>
                      .super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl);
      }
      else {
        this_00 = cmServerProtocol::CMakeInstance(this->Protocol);
        local_1e0._8_8_ = 0;
        local_1c8 = std::
                    _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx:106:7)>
                    ::_M_invoke;
        local_1d0 = std::
                    _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx:106:7)>
                    ::_M_manager;
        local_1e0._M_unused._M_object = &request;
        cmake::SetProgressCallback(this_00,(ProgressCallbackType *)&local_1e0);
        std::_Function_base::~_Function_base((_Function_base *)&local_1e0);
        (*this->Protocol->_vptr_cmServerProtocol[4])(&response,this->Protocol,&request);
        WriteResponse(this,connection,&response,
                      (DebugInfo *)
                      debug._M_t.
                      super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>
                      .super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl);
      }
    }
    cmServerResponse::~cmServerResponse(&response);
    cmServerRequest::~cmServerRequest(&request);
    Json::Value::~Value(&debugValue);
    std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::~unique_ptr
              (&debug);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&response,"Failed to parse JSON input.",(allocator<char> *)&request);
    WriteParseError(this,connection,&response.Type);
    std::__cxx11::string::~string((string *)&response);
  }
  Json::Value::~Value(&value);
  Json::Reader::~Reader(&reader);
  return;
}

Assistant:

void cmServer::ProcessRequest(cmConnection* connection,
                              const std::string& input)
{
  Json::Reader reader;
  Json::Value value;
  if (!reader.parse(input, value)) {
    this->WriteParseError(connection, "Failed to parse JSON input.");
    return;
  }

  std::unique_ptr<DebugInfo> debug;
  Json::Value debugValue = value["debug"];
  if (!debugValue.isNull()) {
    debug = cm::make_unique<DebugInfo>();
    debug->OutputFile = debugValue["dumpToFile"].asString();
    debug->PrintStatistics = debugValue["showStats"].asBool();
  }

  const cmServerRequest request(this, connection, value[kTYPE_KEY].asString(),
                                value[kCOOKIE_KEY].asString(), value);

  if (request.Type.empty()) {
    cmServerResponse response(request);
    response.SetError("No type given in request.");
    this->WriteResponse(connection, response, nullptr);
    return;
  }

  cmSystemTools::SetMessageCallback(
    [&request](const std::string& msg, const char* title) {
      reportMessage(msg, title, request);
    });

  if (this->Protocol) {
    this->Protocol->CMakeInstance()->SetProgressCallback(
      [&request](const std::string& msg, float prog) {
        reportProgress(msg, prog, request);
      });
    this->WriteResponse(connection, this->Protocol->Process(request),
                        debug.get());
  } else {
    this->WriteResponse(connection, this->SetProtocolVersion(request),
                        debug.get());
  }
}